

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asynclog.cpp
# Opt level: O0

void __thiscall AsyncLog::Append(AsyncLog *this,char *data,size_t writeSize)

{
  bool bVar1;
  type mutex;
  pointer pFVar2;
  Mutex *pMVar3;
  FixedBuffer<4096UL> *this_00;
  pointer this_01;
  LockGuard local_28;
  LockGuard lock;
  size_t writeSize_local;
  char *data_local;
  AsyncLog *this_local;
  
  lock.m_mutex = (Mutex *)writeSize;
  mutex = std::unique_ptr<Mutex,_std::default_delete<Mutex>_>::operator*(&this->m_mutex);
  LockGuard::LockGuard(&local_28,mutex);
  pFVar2 = std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
           operator->(&this->m_curBuff);
  pMVar3 = (Mutex *)FixedBuffer<4096UL>::Avail(pFVar2);
  if (lock.m_mutex < pMVar3) {
    pFVar2 = std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
             operator->(&this->m_curBuff);
    FixedBuffer<4096UL>::Append(pFVar2,data,(size_t)lock.m_mutex);
  }
  else {
    std::
    vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
    ::push_back(&this->m_buffers,&this->m_curBuff);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_nextBuff);
    if (bVar1) {
      std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::operator=
                (&this->m_curBuff,&this->m_nextBuff);
    }
    else {
      this_00 = (FixedBuffer<4096UL> *)operator_new(0x1008);
      FixedBuffer<4096UL>::FixedBuffer(this_00);
      std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::reset
                (&this->m_curBuff,this_00);
    }
    pFVar2 = std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>::
             operator->(&this->m_curBuff);
    FixedBuffer<4096UL>::Append(pFVar2,data,(size_t)lock.m_mutex);
    this_01 = std::unique_ptr<Condition,_std::default_delete<Condition>_>::operator->
                        (&this->m_subThreadFlushCond);
    Condition::Notify(this_01);
  }
  LockGuard::~LockGuard(&local_28);
  return;
}

Assistant:

void AsyncLog::Append(const char * data, size_t writeSize)
{
	//std::cout << "Main thread, " << __LINE__ << std::endl;
	LockGuard lock(*m_mutex);
	if (m_curBuff->Avail() > writeSize)
	{
		//std::cout << __FILE__ << " " << __LINE__ << " " << __func__ << " m_curBuff->Avail()="  << m_curBuff->Avail() << " writeSize=" << writeSize << std::endl;
		m_curBuff->Append(data, writeSize);
	}
	else
	{
		m_buffers.push_back(std::move(m_curBuff));
		if (m_nextBuff)
		{
			m_curBuff = std::move(m_nextBuff);
		}
		else
		{
			m_curBuff.reset(new Buffer);
		}
		m_curBuff->Append(data, writeSize);
		m_subThreadFlushCond->Notify();
	}
	//std::cout << "Main thread, " << __LINE__ << std::endl;
}